

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSkinnedMesh.cpp
# Opt level: O2

void __thiscall
irr::scene::CSkinnedMesh::calculateTangents
          (CSkinnedMesh *this,vector3df *normal,vector3df *tangent,vector3df *binormal,
          vector3df *vt1,vector3df *vt2,vector3df *vt3,vector2df *tc1,vector2df *tc2,vector2df *tc3)

{
  float fVar1;
  float fVar2;
  vector3d<float> vVar3;
  vector3d<float> local_50;
  vector3d<float> local_40;
  
  local_40 = core::vector3d<float>::operator-(vt1,vt2);
  local_50 = core::vector3d<float>::operator-(vt3,vt1);
  vVar3 = core::vector3d<float>::crossProduct(&local_50,&local_40);
  normal->X = vVar3.X;
  normal->Y = vVar3.Y;
  normal->Z = vVar3.Z;
  core::vector3d<float>::normalize(normal);
  fVar1 = tc3->X - tc1->X;
  fVar2 = tc1->X - tc2->X;
  binormal->X = fVar1 * local_40.X - fVar2 * local_50.X;
  binormal->Y = fVar1 * local_40.Y - fVar2 * local_50.Y;
  binormal->Z = local_40.Z * fVar1 - local_50.Z * fVar2;
  core::vector3d<float>::normalize(binormal);
  fVar1 = tc3->Y - tc1->Y;
  fVar2 = tc1->Y - tc2->Y;
  tangent->X = fVar1 * local_40.X - fVar2 * local_50.X;
  tangent->Y = fVar1 * local_40.Y - fVar2 * local_50.Y;
  tangent->Z = local_40.Z * fVar1 - local_50.Z * fVar2;
  core::vector3d<float>::normalize(tangent);
  vVar3 = core::vector3d<float>::crossProduct(tangent,binormal);
  if (vVar3.Z * normal->Z + normal->X * vVar3.X + vVar3.Y * normal->Y < 0.0) {
    core::vector3d<float>::operator*=(tangent,-1.0);
    core::vector3d<float>::operator*=(binormal,-1.0);
  }
  return;
}

Assistant:

void CSkinnedMesh::calculateTangents(
		core::vector3df &normal,
		core::vector3df &tangent,
		core::vector3df &binormal,
		const core::vector3df &vt1, const core::vector3df &vt2, const core::vector3df &vt3, // vertices
		const core::vector2df &tc1, const core::vector2df &tc2, const core::vector2df &tc3) // texture coords
{
	core::vector3df v1 = vt1 - vt2;
	core::vector3df v2 = vt3 - vt1;
	normal = v2.crossProduct(v1);
	normal.normalize();

	// binormal

	f32 deltaX1 = tc1.X - tc2.X;
	f32 deltaX2 = tc3.X - tc1.X;
	binormal = (v1 * deltaX2) - (v2 * deltaX1);
	binormal.normalize();

	// tangent

	f32 deltaY1 = tc1.Y - tc2.Y;
	f32 deltaY2 = tc3.Y - tc1.Y;
	tangent = (v1 * deltaY2) - (v2 * deltaY1);
	tangent.normalize();

	// adjust

	core::vector3df txb = tangent.crossProduct(binormal);
	if (txb.dotProduct(normal) < 0.0f) {
		tangent *= -1.0f;
		binormal *= -1.0f;
	}
}